

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O2

int csp_conn_flush_rx_queue(csp_conn_t *conn)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  csp_packet_t *packet;
  void *local_18;
  
  local_18 = (void *)CONCAT44(in_register_00000004,in_EAX);
  while( true ) {
    iVar1 = csp_queue_dequeue(conn->rx_queue,&local_18,0);
    if (iVar1 != 0) break;
    if (local_18 != (void *)0x0) {
      csp_buffer_free(local_18);
    }
  }
  return iVar1;
}

Assistant:

static int csp_conn_flush_rx_queue(csp_conn_t * conn) {

	csp_packet_t * packet;

	/* Flush packet queues */
	while (csp_queue_dequeue(conn->rx_queue, &packet, 0) == CSP_QUEUE_OK) {
		if (packet != NULL) {
			csp_buffer_free(packet);
		}
	}

	return CSP_ERR_NONE;
}